

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ValidationError::~ValidationError(ValidationError *this)

{
  void *in_RDI;
  
  ~ValidationError((ValidationError *)0x13ef48);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}